

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

cmGeneratedFileStream * __thiscall
cmGeneratedFileStream::Open(cmGeneratedFileStream *this,string *name,bool quiet,bool binaryFlag)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_1a;
  byte local_19;
  bool binaryFlag_local;
  string *psStack_18;
  bool quiet_local;
  string *name_local;
  cmGeneratedFileStream *this_local;
  
  local_1a = binaryFlag;
  local_19 = quiet;
  psStack_18 = name;
  name_local = (string *)this;
  cmGeneratedFileStreamBase::Open
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  if ((local_1a & 1) == 0) {
    _Var1 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)this,_Var1);
  }
  else {
    _Var1 = std::__cxx11::string::c_str();
    std::operator|(_S_out,_S_bin);
    std::ofstream::open((char *)this,_Var1);
  }
  uVar2 = std::ios::operator!((ios *)((long)&(this->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if (((uVar2 & 1) != 0) && ((local_19 & 1) == 0)) {
    std::operator+(&local_40,"Cannot open file for write: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_ofstream).field_0x118);
    cmSystemTools::Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    cmSystemTools::ReportLastSystemError("");
  }
  return this;
}

Assistant:

cmGeneratedFileStream& cmGeneratedFileStream::Open(std::string const& name,
                                                   bool quiet, bool binaryFlag)
{
  // Store the file name and construct the temporary file name.
  this->cmGeneratedFileStreamBase::Open(name);

  // Open the temporary output file.
  if (binaryFlag) {
    this->Stream::open(this->TempName.c_str(),
                       std::ios::out | std::ios::binary);
  } else {
    this->Stream::open(this->TempName.c_str());
  }

  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: " + this->TempName);
    cmSystemTools::ReportLastSystemError("");
  }
  return *this;
}